

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

int __thiscall leveldb::DBTest::NumTableFilesAtLevel(DBTest *this,int level)

{
  DB *pDVar1;
  int iVar2;
  uint64_t num;
  string property;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  Tester local_1b0;
  
  property._M_dataplus._M_p = (pointer)&property.field_2;
  property._M_string_length = 0;
  property.field_2._M_local_buf[0] = '\0';
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x196);
  pDVar1 = this->db_;
  NumberToString_abi_cxx11_(&local_200,(leveldb *)(long)level,num);
  std::operator+(&local_1e0,"leveldb.num-files-at-level",&local_200);
  local_1c0 = local_1e0._M_dataplus._M_p._0_4_;
  uStack_1bc = local_1e0._M_dataplus._M_p._4_4_;
  uStack_1b8 = (undefined4)local_1e0._M_string_length;
  uStack_1b4 = local_1e0._M_string_length._4_4_;
  iVar2 = (*pDVar1->_vptr_DB[9])(pDVar1,&local_1c0,&property);
  test::Tester::Is(&local_1b0,SUB41(iVar2,0),
                   "db_->GetProperty( \"leveldb.num-files-at-level\" + NumberToString(level), &property)"
                  );
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  test::Tester::~Tester(&local_1b0);
  iVar2 = std::__cxx11::stoi(&property,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&property);
  return iVar2;
}

Assistant:

int NumTableFilesAtLevel(int level) {
    std::string property;
    ASSERT_TRUE(db_->GetProperty(
        "leveldb.num-files-at-level" + NumberToString(level), &property));
    return std::stoi(property);
  }